

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlareState.cpp
# Opt level: O2

void __thiscall KDIS::DATA_TYPE::FlareState::Encode(FlareState *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_int>(stream,(this->super_EnvironmentRecord).m_ui32EnvRecTyp);
  KDataStream::Write<unsigned_short>(stream,(this->super_EnvironmentRecord).m_ui16Length);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Index);
  KDataStream::Write(stream,(this->super_EnvironmentRecord).m_ui8Padding);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32TSC);
  (*(this->m_Src).super_DataTypeBase._vptr_DataTypeBase[5])(&this->m_Src,stream);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32NumInt);
  KDataStream::Write<unsigned_int>(stream,this->m_ui32NumSrcs);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16GeometryIndex);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding);
  return;
}

Assistant:

void FlareState::Encode( KDataStream & stream ) const
{
    stream << m_ui32EnvRecTyp
           << m_ui16Length
           << m_ui8Index
           << m_ui8Padding
           << m_ui32TSC
           << KDIS_STREAM m_Src
           << m_ui32NumInt
           << m_ui32NumSrcs
           << m_ui16GeometryIndex
           << m_ui16Padding;
}